

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O1

void __thiscall
Assimp::ZipArchiveIOSystem::Implement::Implement
          (Implement *this,IOSystem *pIOHandler,char *pFilename,char *pMode)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  unzFile pvVar3;
  zlib_filefunc_def mapping;
  
  this->m_ZipFileHandle = (unzFile)0x0;
  p_Var1 = &(this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar2 = strcmp(pMode,"r");
  if (iVar2 != 0) {
    __assert_fail("strcmp(pMode, \"r\") == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/ZipArchiveIOSystem.cpp"
                  ,0x150,
                  "Assimp::ZipArchiveIOSystem::Implement::Implement(IOSystem *, const char *, const char *)"
                 );
  }
  if (pFilename != (char *)0x0) {
    if (*pFilename != '\0') {
      pvVar3 = (unzFile)unzOpen2(pFilename);
      this->m_ZipFileHandle = pvVar3;
    }
    return;
  }
  __assert_fail("pFilename != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/ZipArchiveIOSystem.cpp"
                ,0x151,
                "Assimp::ZipArchiveIOSystem::Implement::Implement(IOSystem *, const char *, const char *)"
               );
}

Assistant:

ZipArchiveIOSystem::Implement::Implement(IOSystem* pIOHandler, const char* pFilename, const char* pMode) {
        ai_assert(strcmp(pMode, "r") == 0);
        ai_assert(pFilename != nullptr);
        if (pFilename[0] == 0)
            return;

        zlib_filefunc_def mapping = IOSystem2Unzip::get(pIOHandler);
        m_ZipFileHandle = unzOpen2(pFilename, &mapping);
    }